

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O3

Vec3<double> * __thiscall
nanovdb::Map::applyInverseMapF<nanovdb::Vec3<double>>(Map *this,Vec3<double> *xyz)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Vec3<double> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])(this->mInvMatF + 2),
                          ZEXT416((uint)this->mInvMatF[5]),0x10);
  auVar1 = vinsertps_avx(*(undefined1 (*) [16])(this->mInvMatF + 1),ZEXT416((uint)this->mInvMatF[4])
                         ,0x10);
  auVar10 = vcvtps2pd_avx(auVar10);
  dVar2 = xyz->mVec[0] - (double)this->mVecF[0];
  auVar5._0_4_ = (float)dVar2;
  auVar5._4_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar5._8_8_ = 0;
  dVar2 = xyz->mVec[1] - (double)this->mVecF[1];
  auVar7._0_4_ = (float)dVar2;
  auVar7._4_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar7._8_8_ = 0;
  dVar3 = xyz->mVec[2] - (double)this->mVecF[2];
  dVar2 = dVar3 * (double)this->mInvMatF[8];
  auVar9._0_8_ = dVar3 * auVar10._0_8_;
  auVar9._8_8_ = dVar3 * auVar10._8_8_;
  auVar10._0_4_ = (float)dVar2;
  auVar10._4_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar10._8_8_ = 0;
  auVar4 = vfmadd231ss_fma(auVar10,auVar7,ZEXT416((uint)this->mInvMatF[7]));
  auVar8._4_4_ = auVar7._0_4_;
  auVar8._0_4_ = auVar7._0_4_;
  auVar8._8_4_ = auVar7._0_4_;
  auVar8._12_4_ = auVar7._0_4_;
  auVar10 = vcvtpd2ps_avx(auVar9);
  auVar4 = vfmadd231ss_fma(auVar4,auVar5,ZEXT416((uint)this->mInvMatF[6]));
  auVar1 = vfmadd213ps_fma(auVar1,auVar8,auVar10);
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])this->mInvMatF,ZEXT416((uint)this->mInvMatF[3]),0x10
                         );
  auVar6._4_4_ = auVar5._0_4_;
  auVar6._0_4_ = auVar5._0_4_;
  auVar6._8_4_ = auVar5._0_4_;
  auVar6._12_4_ = auVar5._0_4_;
  auVar10 = vfmadd213ps_fma(auVar10,auVar6,auVar1);
  auVar10 = vcvtps2pd_avx(auVar10);
  *(undefined1 (*) [16])in_RDI->mVec = auVar10;
  in_RDI->mVec[2] = (double)auVar4._0_4_;
  return in_RDI;
}

Assistant:

__hostdev__ Vec3T applyInverseMapF(const Vec3T& xyz) const
    {
        return matMult(mInvMatF, Vec3T(xyz[0] - mVecF[0], xyz[1] - mVecF[1], xyz[2] - mVecF[2]));
    }